

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class.hpp
# Opt level: O2

void __thiscall
boost::python::
class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
::
def_impl<AbstractModuleClient,int(MlmWrap::*)(HighFreqDataType),boost::python::detail::def_helper<char_const*,boost::python::detail::not_specified,boost::python::detail::not_specified,boost::python::detail::not_specified>>
          (class_<PythonModuleClient,boost::noncopyable_::noncopyable,boost::python::detail::not_specified,boost::python::detail::not_specified>
           *this,AbstractModuleClient *param_1,char *name,first_type fn,
          def_helper<const_char_*,_boost::python::detail::not_specified,_boost::python::detail::not_specified,_boost::python::detail::not_specified>
          *helper,...)

{
  undefined8 *in_R9;
  vector3<int,_AbstractModuleClient_&,_HighFreqDataType> local_29;
  object_base local_28;
  
  make_function<int(MlmWrap::*)(HighFreqDataType),boost::python::default_call_policies,boost::python::detail::keywords<0ul>,boost::mpl::vector3<int,AbstractModuleClient&,HighFreqDataType>>
            ((first_type)&local_28,(default_call_policies *)fn,(keywords<0UL> *)helper,&local_29);
  objects::add_to_namespace((object *)this,name,(object *)&local_28,*(char **)*in_R9);
  api::object_base::~object_base(&local_28);
  return;
}

Assistant:

inline void def_impl(
        T*
      , char const* name
      , Fn fn
      , Helper const& helper
      , ...
    )
    {
        objects::add_to_namespace(
            *this
          , name
          , make_function(
                fn
              , helper.policies()
              , helper.keywords()
              , detail::get_signature(fn, (T*)0)
            )
          , helper.doc()
        );

        this->def_default(name, fn, helper, mpl::bool_<Helper::has_default_implementation>());
    }